

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

void __thiscall Server::~Server(Server *this)

{
  list<Client_*,_std::allocator<Client_*>_> *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  this->_vptr_Server = (_func_int **)&PTR_ClientFactory_001d3bd0;
  plVar1 = &this->clients;
  for (p_Var3 = (this->clients).super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var3 != (_List_node_base *)plVar1;
      p_Var3 = p_Var3->_M_next) {
    p_Var2 = p_Var3[1]._M_next;
    close(*(int *)&p_Var2->_M_prev->_M_next);
    if (p_Var2 != (_List_node_base *)0x0) {
      (**(code **)((long)p_Var2->_M_next + 0x10))(p_Var2);
    }
  }
  close(this->impl->sock);
  if (this->impl != (impl_ *)0x0) {
    operator_delete(this->impl,0x188);
  }
  p_Var3 = (plVar1->super__List_base<Client_*,_std::allocator<Client_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)plVar1) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  return;
}

Assistant:

Server::~Server()
{
	UTIL_FOREACH(this->clients, client)
	{
#ifdef WIN32
		closesocket(client->impl->sock);
#else // WIN32
		close(client->impl->sock);
#endif // WIN32
		delete client;
	}

#ifdef WIN32
	closesocket(this->impl->sock);
#else // WIN32
	close(this->impl->sock);
#endif // WIN32

	delete this->impl;
}